

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O3

int av1_joint_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *cur_mv,uint8_t *mask,
              int mask_stride,int *rate_mv,int allow_second_mv,int joint_me_num_refine_iter)

{
  MACROBLOCKD *xd;
  undefined8 *puVar1;
  char cVar2;
  _Bool _Var3;
  MB_MODE_INFO *pMVar4;
  MvCosts *mvjcost;
  YV12_BUFFER_CONFIG *src;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  MACROBLOCK *pMVar14;
  bool bVar15;
  byte search_method;
  uint uVar16;
  int_mv iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  buf_2d *pbVar22;
  InterpFilterParams *pIVar23;
  uint uVar24;
  undefined7 in_register_00000011;
  uint8_t *dst;
  FULLPEL_MV start_mv;
  long lVar25;
  int_mv *piVar26;
  ulong uVar27;
  long lVar28;
  InterpFilterParams *pIVar29;
  YV12_BUFFER_CONFIG **ppYVar30;
  buf_2d *pbVar31;
  uint num_planes;
  uint uVar32;
  uint uVar33;
  search_site_config *search_sites;
  ulong uVar34;
  bool bVar35;
  int_mv best_mv;
  char local_84c5;
  int_mv second_best_mv;
  buf_2d *local_84c0;
  MACROBLOCK *local_84b8;
  uint local_84b0;
  uint local_84ac;
  int local_84a8;
  uint local_84a4;
  int last_besterr [2];
  MV this_best_mv;
  uint sse;
  int dis;
  YV12_BUFFER_CONFIG *local_8448;
  AV1_COMMON *local_8440;
  ulong local_8438;
  search_site_config *local_8430;
  uint8_t *local_8428;
  ulong local_8420;
  ulong local_8418;
  YV12_BUFFER_CONFIG *local_8410;
  undefined8 local_8408;
  int_mv ref_mv [2];
  buf_2d ref_yv12 [2];
  InterPredParams local_8368;
  FULLPEL_MV_STATS best_mv_stats;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  buf_2d backup_yv12 [2] [3];
  uint8_t second_pred16 [32768];
  
  uVar27 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  pMVar4 = *(x->e_mbd).mi;
  local_8408 = *(undefined8 *)cur_mv;
  cVar2 = pMVar4->ref_frame[1];
  mvjcost = x->mv_costs;
  local_8418 = (ulong)(uint)(x->e_mbd).mi_row;
  local_8420 = (ulong)(uint)(x->e_mbd).mi_col;
  last_besterr[0] = 0x7fffffff;
  last_besterr[1] = 0x7fffffff;
  local_84ac = (uint)block_size_wide[uVar27];
  local_84b0 = (uint)block_size_high[uVar27];
  local_84c0 = (buf_2d *)CONCAT71(local_84c0._1_7_,((cpi->common).seq_params)->monochrome == '\0');
  local_84a8 = mask_stride;
  local_8428 = mask;
  local_8448 = av1_get_scaled_ref_frame(cpi,(int)pMVar4->ref_frame[0]);
  local_8410 = av1_get_scaled_ref_frame(cpi,(int)cVar2);
  dst = (uint8_t *)((ulong)second_pred16 >> 1);
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    dst = second_pred16;
  }
  local_84b8 = x;
  if (0 < joint_me_num_refine_iter) {
    local_8440 = &cpi->common;
    num_planes = (uint)(byte)local_84c0 * 2 + 1;
    xd = &x->e_mbd;
    local_84c0 = (x->e_mbd).plane[0].pre;
    iVar20 = (int)local_8418;
    pIVar29 = av1_interp_4tap;
    pIVar23 = av1_interp_4tap;
    if ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      pIVar23 = av1_interp_filter_params_list;
    }
    if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      pIVar29 = av1_interp_filter_params_list;
    }
    local_84a4 = local_84b0;
    if ((byte)local_84ac < (byte)local_84b0) {
      local_84a4 = local_84ac;
    }
    uVar16 = 1;
    if (1 < joint_me_num_refine_iter * 2) {
      uVar16 = joint_me_num_refine_iter * 2;
    }
    iVar5 = (int)local_8420;
    local_8430 = x->search_site_cfg_buf;
    uVar32 = 0;
    do {
      uVar33 = uVar32 & 1;
      uVar27 = (ulong)uVar33;
      if ((1 < uVar32) &&
         (uVar21 = (ulong)((uVar33 ^ 1) << 2),
         *(int *)((long)cur_mv + uVar21) == *(int *)((long)ref_mv + (uVar21 - 8)))) {
        iVar18 = *(int *)((long)cur_mv + (ulong)(uVar33 * 4));
        iVar19 = *(int *)((long)ref_mv + ((ulong)(uVar33 * 4) - 8));
        if ((iVar18 == iVar19) ||
           (((uint)(int)(short)iVar18 >> 3 & 0xffff | (iVar18 >> 0x13) << 0x10) ==
            ((uint)(int)(short)iVar19 >> 3 & 0xffff | (iVar19 >> 0x13) << 0x10))) break;
      }
      ppYVar30 = &local_8448;
      piVar26 = ref_mv;
      lVar25 = 0;
      bVar15 = true;
      do {
        bVar35 = bVar15;
        iVar17 = av1_get_ref_mv(local_84b8,(int)lVar25);
        *piVar26 = iVar17;
        src = *ppYVar30;
        if (src != (YV12_BUFFER_CONFIG *)0x0) {
          pbVar22 = backup_yv12[lVar25];
          lVar28 = 0;
          do {
            puVar1 = (undefined8 *)((long)&local_84c0[lVar25].buf + lVar28);
            puVar10 = (uint8_t *)*puVar1;
            puVar11 = (uint8_t *)puVar1[1];
            puVar1 = (undefined8 *)((long)&local_84c0[lVar25].width + lVar28);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            pbVar22->width = (int)uVar12;
            pbVar22->height = (int)((ulong)uVar12 >> 0x20);
            *(undefined8 *)&pbVar22->stride = uVar13;
            ((buf_2d *)&pbVar22->buf)->buf = puVar10;
            pbVar22->buf0 = puVar11;
            pbVar22 = pbVar22 + 1;
            lVar28 = lVar28 + 0xa30;
          } while ((ulong)num_planes * 0xa30 - lVar28 != 0);
          av1_setup_pre_planes
                    (xd,(int)lVar25,src,(int)local_8418,(int)local_8420,(scale_factors *)0x0,
                     num_planes);
        }
        pMVar14 = local_84b8;
        pbVar22 = local_84c0;
        lVar25 = 1;
        ppYVar30 = &local_8410;
        piVar26 = ref_mv + 1;
        bVar15 = false;
      } while (bVar35);
      ref_yv12[0].width = local_84c0->width;
      ref_yv12[0].height = local_84c0->height;
      ref_yv12[0].stride = local_84c0->stride;
      ref_yv12[0]._28_4_ = *(undefined4 *)&local_84c0->field_0x1c;
      ref_yv12[0].buf = local_84c0->buf;
      ref_yv12[0].buf0 = local_84c0->buf0;
      ref_yv12[1].width = (x->e_mbd).plane[0].pre[1].width;
      ref_yv12[1].height = (x->e_mbd).plane[0].pre[1].height;
      ref_yv12[1].stride = (x->e_mbd).plane[0].pre[1].stride;
      ref_yv12[1]._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[1].field_0x1c;
      ref_yv12[1].buf = (x->e_mbd).plane[0].pre[1].buf;
      ref_yv12[1].buf0 = (x->e_mbd).plane[0].pre[1].buf0;
      local_8368.bit_depth = (local_84b8->e_mbd).bd;
      local_8368.block_width = local_84ac;
      local_8368.block_height = local_84b0;
      local_8368.pix_row = iVar20 * 4;
      local_8368.pix_col = iVar5 * 4;
      local_8368.subsampling_x = 0;
      local_8368.subsampling_y = 0;
      local_8368.use_hbd_buf = (uint)((local_84b8->e_mbd).cur_buf)->flags >> 3 & 1;
      uVar21 = (ulong)((uVar33 ^ 1) << 5);
      local_8368.is_intrabc = 0;
      local_8368.mode = TRANSLATION_PRED;
      local_8368.comp_mode = UNIFORM_SINGLE;
      local_8368.top = -0x47000;
      local_8368.left = -0x47000;
      local_8368.interp_filter_params[0] = pIVar23;
      local_8368.interp_filter_params[1] = pIVar29;
      local_8368.scale_factors = &(cpi->common).sf_identity;
      local_8368.ref_frame_buf.buf = *(uint8_t **)((long)&ref_yv12[0].buf + uVar21);
      local_8368.ref_frame_buf.buf0 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar21);
      local_8368.ref_frame_buf._16_8_ = *(undefined8 *)((long)&ref_yv12[0].width + uVar21);
      local_8368.ref_frame_buf._24_8_ = *(undefined8 *)((long)&ref_yv12[0].stride + uVar21);
      local_8368.conv_params.round_1 = 0x15 - local_8368.bit_depth;
      local_8368.conv_params.round_0 = local_8368.bit_depth + -7;
      if (local_8368.bit_depth < 0xb) {
        local_8368.conv_params.round_0 = 3;
      }
      local_8368.conv_params.do_average = 0;
      local_8368.conv_params.dst = (CONV_BUF_TYPE *)0x0;
      local_8368.conv_params.dst_stride = 0;
      if (local_8368.bit_depth < 0xb) {
        local_8368.conv_params.round_1 = 0xb;
      }
      local_8368.conv_params.plane = 0;
      local_8368.conv_params.is_compound = 0;
      local_8368.conv_params.use_dist_wtd_comp_avg = 0;
      av1_enc_build_one_inter_predictor(dst,local_84ac,&cur_mv[uVar33 ^ 1].as_mv,&local_8368);
      if (uVar33 != 0) {
        uVar21 = (ulong)(uVar33 << 5);
        uVar6 = *(undefined4 *)((long)&ref_yv12[0].buf + uVar21);
        uVar7 = *(undefined4 *)((long)&ref_yv12[0].buf + uVar21 + 4);
        uVar8 = *(undefined4 *)((long)&ref_yv12[0].buf0 + uVar21);
        uVar9 = *(undefined4 *)((long)&ref_yv12[0].buf0 + uVar21 + 4);
        uVar12 = *(undefined8 *)((long)&ref_yv12[0].width + uVar21);
        uVar13 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar21);
        pbVar22->width = (int)uVar12;
        pbVar22->height = (int)((ulong)uVar12 >> 0x20);
        *(undefined8 *)&pbVar22->stride = uVar13;
        *(undefined4 *)&pbVar22->buf = uVar6;
        *(undefined4 *)((long)&pbVar22->buf + 4) = uVar7;
        *(undefined4 *)&pbVar22->buf0 = uVar8;
        *(undefined4 *)((long)&pbVar22->buf0 + 4) = uVar9;
      }
      search_method = (cpi->sf).mv_sf.search_method;
      iVar18 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
      if ((0x1f < (byte)local_84a4 && iVar18 == 1) ||
         (((1 < iVar18 && 0xf < (byte)local_84a4 &&
           ((pMVar14->content_state_sb).source_sad_nonrd < kHighSad)) && (pMVar14->qindex < 0xc0))))
      {
        if (search_method < 0xb) {
          search_method = (&DAT_00566980)[search_method];
        }
        else {
          search_method = 0;
        }
      }
      iVar18 = (pMVar14->e_mbd).plane[0].pre[0].stride;
      search_sites = (cpi->mv_search_params).search_site_cfg[0];
      if (((iVar18 != (cpi->mv_search_params).search_site_cfg[0][0].stride) &&
          (search_sites = (cpi->mv_search_params).search_site_cfg[1],
          iVar18 != (cpi->mv_search_params).search_site_cfg[1][0].stride)) &&
         (search_sites = local_8430, iVar18 != local_8430[""[search_method]].stride)) {
        (*av1_init_motion_compensation[""[""[search_method]]])
                  (local_8430 + ""[""[search_method]],iVar18,SUB14((search_method & 0xfe) == 2,0));
      }
      uVar21 = (ulong)(uVar33 * 4);
      uVar24 = (uint)*(short *)((long)cur_mv + uVar21 + 2);
      start_mv = (FULLPEL_MV)
                 (((int)*(short *)((long)cur_mv + uVar21) -
                  (~(int)*(short *)((long)cur_mv + uVar21) >> 0x1f)) + 3U >> 3 & 0xffff |
                 (uVar24 - ((int)~uVar24 >> 0x1f)) * 0x2000 + 0x6000 & 0xffff0000);
      av1_make_default_fullpel_ms_params
                (&full_ms_params,cpi,local_84b8,bsize,(MV *)((long)ref_mv + uVar21),start_mv,
                 search_sites,search_method,0);
      full_ms_params.ms_buffers.mask = local_8428;
      full_ms_params.ms_buffers.mask_stride = local_84a8;
      full_ms_params.ms_buffers.second_pred = dst;
      full_ms_params.ms_buffers.inv_mask = uVar33;
      if (((cpi->sf).mv_sf.disable_extensive_joint_motion_search == 0) &&
         ((pMVar4->interinter_comp).type != '\x02')) {
        iVar18 = av1_full_pixel_search
                           (start_mv,&full_ms_params,5,(int *)0x0,&best_mv.as_fullmv,&best_mv_stats,
                            &second_best_mv.as_fullmv);
      }
      else {
        iVar18 = av1_refining_search_8p_c(&full_ms_params,start_mv,&best_mv.as_fullmv);
        second_best_mv = best_mv;
      }
      if (uVar33 != 0) {
        local_84c0->width = ref_yv12[0].width;
        local_84c0->height = ref_yv12[0].height;
        local_84c0->stride = ref_yv12[0].stride;
        *(undefined4 *)&local_84c0->field_0x1c = ref_yv12[0]._28_4_;
        local_84c0->buf = ref_yv12[0].buf;
        local_84c0->buf0 = ref_yv12[0].buf0;
      }
      local_84c5 = allow_second_mv != 0 &&
                   (second_best_mv.as_int != 0x80008000 && second_best_mv.as_int != best_mv.as_int);
      ppYVar30 = &local_8448;
      lVar25 = 0;
      pbVar22 = ref_yv12;
      bVar15 = true;
      do {
        bVar35 = bVar15;
        if (*ppYVar30 != (YV12_BUFFER_CONFIG *)0x0) {
          pbVar31 = local_84c0 + lVar25;
          uVar34 = 0;
          do {
            puVar1 = (undefined8 *)((long)&backup_yv12[lVar25][0].buf + uVar34);
            puVar10 = (uint8_t *)*puVar1;
            puVar11 = (uint8_t *)puVar1[1];
            puVar1 = (undefined8 *)((long)&backup_yv12[lVar25][0].width + uVar34);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            pbVar31->width = (int)uVar12;
            pbVar31->height = (int)((ulong)uVar12 >> 0x20);
            *(undefined8 *)&pbVar31->stride = uVar13;
            pbVar31->buf = puVar10;
            pbVar31->buf0 = puVar11;
            pbVar31 = (buf_2d *)((long)(pbVar31 + 0x51) + 0x10);
            uVar34 = uVar34 + 0x20;
          } while (num_planes * 0x20 != uVar34);
          puVar10 = local_84c0[lVar25].buf;
          puVar11 = local_84c0[lVar25].buf0;
          pbVar31 = local_84c0 + lVar25;
          iVar19 = pbVar31->height;
          uVar12 = *(undefined8 *)(&pbVar31->width + 2);
          pbVar22->width = pbVar31->width;
          pbVar22->height = iVar19;
          *(undefined8 *)&pbVar22->stride = uVar12;
          pbVar22->buf = puVar10;
          pbVar22->buf0 = puVar11;
        }
        lVar25 = 1;
        ppYVar30 = &local_8410;
        pbVar22 = ref_yv12 + 1;
        bVar15 = false;
      } while (bVar35);
      if (uVar33 != 0) {
        uVar34 = (ulong)(uVar33 << 5);
        puVar10 = *(uint8_t **)((long)&ref_yv12[0].buf + uVar34);
        puVar11 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar34);
        uVar12 = *(undefined8 *)((long)&ref_yv12[0].width + uVar34);
        uVar13 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar34);
        local_84c0->width = (int)uVar12;
        local_84c0->height = (int)((ulong)uVar12 >> 0x20);
        *(undefined8 *)&local_84c0->stride = uVar13;
        local_84c0->buf = puVar10;
        local_84c0->buf0 = puVar11;
      }
      _Var3 = (cpi->common).features.cur_frame_force_integer_mv;
      if (_Var3 == true) {
        best_mv.as_int = (best_mv.as_int & 0x1fff1fff) << 3;
      }
      iVar19 = 0x7fffffff;
      if ((iVar18 != 0x7fffffff) && (iVar19 = iVar18, _Var3 == false)) {
        local_8438 = uVar27;
        av1_make_default_subpel_ms_params
                  (&ms_params,cpi,local_84b8,bsize,(MV *)((long)ref_mv + uVar21),(int *)0x0);
        ms_params.var_params.ms_buffers.mask = local_8428;
        ms_params.var_params.ms_buffers.mask_stride = local_84a8;
        ms_params.forced_stop = '\0';
        ms_params.var_params.ms_buffers.second_pred = dst;
        ms_params.var_params.ms_buffers.inv_mask = uVar33;
        iVar19 = (*(cpi->mv_search_params).find_fractional_mv_step)
                           (xd,local_8440,&ms_params,
                            (MV)((best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8)
                            ,(FULLPEL_MV_STATS *)0x0,(MV *)&best_mv,&dis,&sse,(int_mv *)0x0);
        uVar27 = local_8438;
        if (local_84c5 != '\0') {
          if ((ms_params.mv_limits.col_min <= (short)(second_best_mv.as_mv.col * 8)) &&
             ((short)(second_best_mv.as_mv.col * 8) <= ms_params.mv_limits.col_max)) {
            iVar18 = (int)(short)(second_best_mv.as_int << 3);
            if ((ms_params.mv_limits.row_min <= iVar18) &&
               ((iVar18 <= ms_params.mv_limits.row_max &&
                (iVar18 = (*(cpi->mv_search_params).find_fractional_mv_step)
                                    (xd,local_8440,&ms_params,
                                     (MV)(second_best_mv.as_int << 3 & 0xffff |
                                         (uint)(ushort)second_best_mv.as_mv.col << 0x13),
                                     (FULLPEL_MV_STATS *)0x0,&this_best_mv,&dis,&sse,(int_mv *)0x0),
                iVar18 < iVar19)))) {
              best_mv.as_mv = this_best_mv;
              iVar19 = iVar18;
            }
          }
        }
      }
      if (uVar33 != 0) {
        local_84c0->width = ref_yv12[0].width;
        local_84c0->height = ref_yv12[0].height;
        local_84c0->stride = ref_yv12[0].stride;
        *(undefined4 *)&local_84c0->field_0x1c = ref_yv12[0]._28_4_;
        local_84c0->buf = ref_yv12[0].buf;
        local_84c0->buf0 = ref_yv12[0].buf0;
      }
      if (last_besterr[uVar27] <= iVar19) break;
      uVar27 = (ulong)(uint)((int)uVar27 << 2);
      *(int_mv *)((long)cur_mv + uVar27) = best_mv;
      *(int *)((long)last_besterr + uVar27) = iVar19;
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar16);
  }
  pMVar14 = local_84b8;
  *rate_mv = 0;
  lVar25 = 0;
  bVar15 = true;
  do {
    bVar35 = bVar15;
    full_ms_params._0_4_ = av1_get_ref_mv(pMVar14,(int)lVar25);
    iVar20 = av1_mv_bit_cost(&cur_mv[lVar25].as_mv,(MV *)&full_ms_params,mvjcost->nmv_joint_cost,
                             mvjcost->mv_cost_stack,0x6c);
    *rate_mv = *rate_mv + iVar20;
    lVar25 = 1;
    bVar15 = false;
  } while (bVar35);
  if (last_besterr[0] < last_besterr[1]) {
    last_besterr[1] = last_besterr[0];
  }
  return last_besterr[1];
}

Assistant:

int av1_joint_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, int_mv *cur_mv,
                            const uint8_t *mask, int mask_stride, int *rate_mv,
                            int allow_second_mv, int joint_me_num_refine_iter) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int pw = block_size_wide[bsize];
  const int ph = block_size_high[bsize];
  const int plane = 0;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // This function should only ever be called for compound modes
  assert(has_second_ref(mbmi));
  const int_mv init_mv[2] = { cur_mv[0], cur_mv[1] };
  const int refs[2] = { mbmi->ref_frame[0], mbmi->ref_frame[1] };
  const MvCosts *mv_costs = x->mv_costs;
  int_mv ref_mv[2];
  int ite, ref;

  // Get the prediction block from the 'other' reference frame.
  const int_interpfilters interp_filters =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  InterPredParams inter_pred_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Do joint motion search in compound mode to get more accurate mv.
  struct buf_2d backup_yv12[2][MAX_MB_PLANE];
  int last_besterr[2] = { INT_MAX, INT_MAX };
  const YV12_BUFFER_CONFIG *const scaled_ref_frame[2] = {
    av1_get_scaled_ref_frame(cpi, refs[0]),
    av1_get_scaled_ref_frame(cpi, refs[1])
  };

  // Prediction buffer from second frame.
  DECLARE_ALIGNED(16, uint8_t, second_pred16[MAX_SB_SQUARE * sizeof(uint16_t)]);
  uint8_t *second_pred = get_buf_by_bd(xd, second_pred16);

  int_mv best_mv, second_best_mv;

  // Allow joint search multiple times iteratively for each reference frame
  // and break out of the search loop if it couldn't find a better mv.
  for (ite = 0; ite < (2 * joint_me_num_refine_iter); ite++) {
    struct buf_2d ref_yv12[2];
    int bestsme = INT_MAX;
    int id = ite % 2;  // Even iterations search in the first reference frame,
                       // odd iterations search in the second. The predictor
                       // found for the 'other' reference frame is factored in.
    if (ite >= 2 && cur_mv[!id].as_int == init_mv[!id].as_int) {
      if (cur_mv[id].as_int == init_mv[id].as_int) {
        break;
      } else {
        int_mv cur_int_mv, init_int_mv;
        cur_int_mv.as_mv.col = cur_mv[id].as_mv.col >> 3;
        cur_int_mv.as_mv.row = cur_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.row = init_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.col = init_mv[id].as_mv.col >> 3;
        if (cur_int_mv.as_int == init_int_mv.as_int) {
          break;
        }
      }
    }
    for (ref = 0; ref < 2; ++ref) {
      ref_mv[ref] = av1_get_ref_mv(x, ref);
      // Swap out the reference frame for a version that's been scaled to
      // match the resolution of the current frame, allowing the existing
      // motion search code to be used without additional modifications.
      if (scaled_ref_frame[ref]) {
        int i;
        for (i = 0; i < num_planes; i++)
          backup_yv12[ref][i] = xd->plane[i].pre[ref];
        av1_setup_pre_planes(xd, ref, scaled_ref_frame[ref], mi_row, mi_col,
                             NULL, num_planes);
      }
    }

    assert(IMPLIES(scaled_ref_frame[0] != NULL,
                   cm->width == scaled_ref_frame[0]->y_crop_width &&
                       cm->height == scaled_ref_frame[0]->y_crop_height));
    assert(IMPLIES(scaled_ref_frame[1] != NULL,
                   cm->width == scaled_ref_frame[1]->y_crop_width &&
                       cm->height == scaled_ref_frame[1]->y_crop_height));

    // Initialize based on (possibly scaled) prediction buffers.
    ref_yv12[0] = xd->plane[plane].pre[0];
    ref_yv12[1] = xd->plane[plane].pre[1];

    av1_init_inter_params(&inter_pred_params, pw, ph, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &cm->sf_identity, &ref_yv12[!id], interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    // Since we have scaled the reference frames to match the size of the
    // current frame we must use a unit scaling factor during mode selection.
    av1_enc_build_one_inter_predictor(second_pred, pw, &cur_mv[!id].as_mv,
                                      &inter_pred_params);

    // Do full-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    // Make motion search params
    FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
    FULLPEL_MV_STATS best_mv_stats;
    const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
    const SEARCH_METHODS search_method =
        av1_get_default_mv_search_method(x, mv_sf, bsize);
    const search_site_config *src_search_sites =
        av1_get_search_site_config(cpi, x, search_method);
    // Use the mv result from the single mode as mv predictor.
    const FULLPEL_MV start_fullmv = get_fullmv_from_mv(&cur_mv[id].as_mv);
    av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                       &ref_mv[id].as_mv, start_fullmv,
                                       src_search_sites, search_method,
                                       /*fine_search_interval=*/0);

    av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                             mask_stride, id);

    // Small-range full-pixel motion search.
    if (!mv_sf->disable_extensive_joint_motion_search &&
        mbmi->interinter_comp.type != COMPOUND_WEDGE) {
      bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                      &best_mv.as_fullmv, &best_mv_stats,
                                      &second_best_mv.as_fullmv);
    } else {
      bestsme = av1_refining_search_8p_c(&full_ms_params, start_fullmv,
                                         &best_mv.as_fullmv);
      second_best_mv = best_mv;
    }

    const int try_second = second_best_mv.as_int != INVALID_MV &&
                           second_best_mv.as_int != best_mv.as_int &&
                           allow_second_mv;

    // Restore the pointer to the first (possibly scaled) prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];

    for (ref = 0; ref < 2; ++ref) {
      if (scaled_ref_frame[ref]) {
        // Swap back the original buffers for subpel motion search.
        for (int i = 0; i < num_planes; i++) {
          xd->plane[i].pre[ref] = backup_yv12[ref][i];
        }
        // Re-initialize based on unscaled prediction buffers.
        ref_yv12[ref] = xd->plane[plane].pre[ref];
      }
    }

    // Do sub-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    if (cpi->common.features.cur_frame_force_integer_mv) {
      convert_fullmv_to_mv(&best_mv);
    }
    if (bestsme < INT_MAX &&
        cpi->common.features.cur_frame_force_integer_mv == 0) {
      int dis; /* TODO: use dis in distortion calculation later. */
      unsigned int sse;
      SUBPEL_MOTION_SEARCH_PARAMS ms_params;
      av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                        &ref_mv[id].as_mv, NULL);
      av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                               mask, mask_stride, id);
      ms_params.forced_stop = EIGHTH_PEL;
      MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
      assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
      bestsme = cpi->mv_search_params.find_fractional_mv_step(
          xd, cm, &ms_params, start_mv, NULL, &best_mv.as_mv, &dis, &sse, NULL);

      if (try_second) {
        MV this_best_mv;
        MV subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
        if (av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv)) {
          const int thissme = cpi->mv_search_params.find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv, &dis,
              &sse, NULL);
          if (thissme < bestsme) {
            best_mv.as_mv = this_best_mv;
            bestsme = thissme;
          }
        }
      }
    }

    // Restore the pointer to the first prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];
    if (bestsme < last_besterr[id]) {
      cur_mv[id] = best_mv;
      last_besterr[id] = bestsme;
    } else {
      break;
    }
  }

  *rate_mv = 0;

  for (ref = 0; ref < 2; ++ref) {
    const int_mv curr_ref_mv = av1_get_ref_mv(x, ref);
    *rate_mv += av1_mv_bit_cost(&cur_mv[ref].as_mv, &curr_ref_mv.as_mv,
                                mv_costs->nmv_joint_cost,
                                mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }

  return AOMMIN(last_besterr[0], last_besterr[1]);
}